

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator fmt::v5::format_to<char[5],long,char_const*,500ul,char>
                   (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf,
                   char (*format_str) [5],long *args,char **args_1)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_string_view<char> format_str_00;
  iterator iVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  in_RCX;
  char *in_RDX;
  char (*in_RSI) [5];
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *in_RDI;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_long,_const_char_*>
  as;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_long,_const_char_*>
  *in_stack_ffffffffffffff88;
  char **in_stack_ffffffffffffff90;
  long *in_stack_ffffffffffffff98;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_long,_const_char_*>
  *in_stack_ffffffffffffffa0;
  basic_buffer<char> *in_stack_ffffffffffffffc8;
  unsigned_long_long in_stack_ffffffffffffffd0;
  
  internal::check_format_string<long,char_const*,char[5]>(in_RSI);
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_long,_const_char_*>
  ::format_arg_store(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  to_string_view<char>((char *)0x1323ca);
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
  ::basic_format_args<long,char_const*>(in_RDI,in_stack_ffffffffffffff88);
  format_str_00.size_ = (size_t)in_RSI;
  format_str_00.data_ = in_RDX;
  args_00.field_1.values_ = in_RCX.values_;
  args_00.types_ = in_stack_ffffffffffffffd0;
  iVar1 = internal::vformat_to<char>(in_stack_ffffffffffffffc8,format_str_00,args_00);
  return (iterator)iVar1.container;
}

Assistant:

inline typename buffer_context<Char>::type::iterator format_to(
    basic_memory_buffer<Char, SIZE> &buf, const S &format_str,
    const Args &... args) {
  internal::check_format_string<Args...>(format_str);
  typedef typename buffer_context<Char>::type context;
  format_arg_store<context, Args...> as{args...};
  return internal::vformat_to(buf, to_string_view(format_str),
                              basic_format_args<context>(as));
}